

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void new_points_start_do_proc(Am_Object *inter)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *value;
  Am_Object_Method method;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  fix_feedback_for_inter(inter);
  local_28.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_28.Call = (Am_Object_Method_Type *)0x0;
  value = Am_Object::Get(&Am_New_Points_Interactor,199,0);
  Am_Object_Method::operator=(&local_28,value);
  pAVar1 = local_28.Call;
  Am_Object::Am_Object(&local_30,inter);
  (*pAVar1)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, new_points_start_do, (Am_Object inter))
{
  fix_feedback_for_inter(inter);
  //now call the prototype's method, which we have stored as the REDO method
  Am_Object_Method method;
  method = Am_New_Points_Interactor.Get(Am_START_DO_METHOD);
  method.Call(inter);
}